

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O2

TPZSavable * __thiscall
TPZRestoreClass<TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_>_>::Restore
          (TPZRestoreClass<TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_>_> *this)

{
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_> *this_00;
  
  this_00 = (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_> *)operator_new(200);
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_>::TPZCompElPostProc(this_00);
  return (TPZSavable *)
         ((long)(this_00->super_TPZCompElH1<pzshape::TPZShapeQuad>).fConnectIndexes.fExtAlloc +
         *(long *)(*(long *)&(this_00->super_TPZCompElH1<pzshape::TPZShapeQuad>).
                             super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
                             super_TPZInterpolationSpace.super_TPZCompEl + -0x60) + -0x70);
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }